

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Measurement *m_00;
  char cVar1;
  int iVar2;
  ostream *poVar3;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this;
  Sensor *this_00;
  Sensor *this_01;
  mapped_type *ppSVar4;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pDVar5;
  MeasurementFactory *this_02;
  istream *piVar6;
  pointer ppMVar7;
  bool bVar8;
  Measurement *m;
  MeasurementContainer measurements;
  VectorXd lidar_noise;
  VectorXd radar_noise;
  _Vector_base<Measurement_*,_std::allocator<Measurement_*>_> local_6a8;
  _Vector_base<Measurement_*,_std::allocator<Measurement_*>_> local_690;
  SensorContainer sensors;
  string line;
  string local_628;
  string local_608;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
  local_5e8;
  UnscentedKalmanFilter ukf;
  ofstream out_file;
  ifstream in_file;
  
  ukf_parameters.std_a = 2.5;
  ukf_parameters.std_yawdd = 0.8;
  ukf_parameters.pred_rate = 20.0;
  ukf_parameters.debug = 0;
  ukf_parameters.type = UKFClassic;
  ukf_parameters.k = 0;
  ukf_parameters.beta = 2;
  ukf_parameters.alpha = 0.001;
  n_meas = -1;
  bVar8 = false;
  do {
    iVar2 = getopt(argc,argv,"s:b:k:t:p:n:dlra:y:");
    switch(iVar2) {
    case 0x61:
      ukf_parameters.std_a = atof(_optarg);
      break;
    case 0x62:
      ukf_parameters.beta = atoi(_optarg);
      break;
    case 100:
      ukf_parameters.debug = ukf_parameters.debug + 1;
      break;
    case 0x6b:
      ukf_parameters.k = atoi(_optarg);
      bVar8 = true;
      break;
    case 0x6c:
      use_lidar = true;
      break;
    case 0x6e:
      n_meas = atoi(_optarg);
      break;
    case 0x70:
      iVar2 = atoi(_optarg);
      ukf_parameters.pred_rate = (double)iVar2;
      break;
    case 0x72:
      use_radar = true;
      break;
    case 0x73:
      ukf_parameters.alpha = atof(_optarg);
      break;
    case 0x74:
      ukf_parameters.type = atoi(_optarg);
      break;
    case 0x79:
      ukf_parameters.std_yawdd = atof(_optarg);
      break;
    default:
      if (iVar2 == -1) {
        if (UKFScaled < ukf_parameters.type) {
          ukf_parameters.type = UKFClassic;
        }
        if (!bVar8) {
          ukf_parameters.k = (uint)(ukf_parameters.type != UKFScaled) * 3;
        }
        if ((use_lidar == false) && (use_radar == false)) {
          use_radar = true;
          use_lidar = true;
        }
        if (ukf_parameters.debug != 0) {
          poVar3 = std::operator<<((ostream *)&std::cout,"lidar: ");
          poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
          poVar3 = std::operator<<(poVar3," radar: ");
          poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
          std::operator<<(poVar3," std_a: ");
          poVar3 = std::ostream::_M_insert<double>(ukf_parameters.std_a);
          std::operator<<(poVar3," std_yawdd: ");
          poVar3 = std::ostream::_M_insert<double>(ukf_parameters.std_yawdd);
          poVar3 = std::operator<<(poVar3," measurements: ");
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,n_meas);
          poVar3 = std::operator<<(poVar3," debug: ");
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,ukf_parameters.debug);
          std::endl<char,std::char_traits<char>>(poVar3);
        }
        if (_optind + 2 == argc) {
          std::__cxx11::string::assign((char *)&in_filename_abi_cxx11_);
          std::__cxx11::string::assign((char *)&out_filename_abi_cxx11_);
          if (ukf_parameters.debug != 0) {
            poVar3 = std::operator<<((ostream *)&std::cout,"in file: ");
            poVar3 = std::operator<<(poVar3,(string *)&in_filename_abi_cxx11_);
            std::endl<char,std::char_traits<char>>(poVar3);
            poVar3 = std::operator<<((ostream *)&std::cout,"out file: ");
            poVar3 = std::operator<<(poVar3,(string *)&out_filename_abi_cxx11_);
            std::endl<char,std::char_traits<char>>(poVar3);
          }
          std::ifstream::ifstream(&in_file,in_filename_abi_cxx11_._M_dataplus._M_p,_S_in);
          std::ofstream::ofstream(&out_file,out_filename_abi_cxx11_._M_dataplus._M_p,_S_out);
          cVar1 = std::__basic_file<char>::is_open();
          if (cVar1 == '\0') {
            poVar3 = std::operator<<((ostream *)&std::cerr,"Cannot open input file: ");
            poVar3 = std::operator<<(poVar3,(string *)&in_filename_abi_cxx11_);
            std::endl<char,std::char_traits<char>>(poVar3);
          }
          else {
            cVar1 = std::__basic_file<char>::is_open();
            if (cVar1 != '\0') {
              radar_noise.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data = (double *)Eigen::internal::aligned_malloc(0x18);
              ukf._vptr_UnscentedKalmanFilter = (_func_int **)&radar_noise;
              radar_noise.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows = 3;
              ukf.std_a_ = 0.0;
              ukf.std_yawdd_ = 4.94065645841247e-324;
              ukf.pred_rate_ = 4.94065645841247e-324;
              *radar_noise.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data = 0.3;
              this = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                               ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&ukf,
                                &std_radphi);
              Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                        (this,&std_radrd);
              Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
                        ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&ukf);
              lidar_noise.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data = (double *)Eigen::internal::aligned_malloc(0x10);
              ukf._vptr_UnscentedKalmanFilter = (_func_int **)&lidar_noise;
              lidar_noise.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows = 2;
              ukf.std_a_ = 0.0;
              ukf.std_yawdd_ = 4.94065645841247e-324;
              ukf.pred_rate_ = 4.94065645841247e-324;
              *lidar_noise.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data = 0.15;
              Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&ukf,
                         &std_laspx);
              Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
                        ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&ukf);
              this_00 = (Sensor *)operator_new(0x48);
              std::__cxx11::string::string((string *)&local_608,"R",(allocator *)&ukf);
              RadarSensor::RadarSensor
                        ((RadarSensor *)this_00,&local_608,&radar_noise,ukf_parameters.debug);
              std::__cxx11::string::~string((string *)&local_608);
              this_01 = (Sensor *)operator_new(0x48);
              std::__cxx11::string::string((string *)&local_628,"L",(allocator *)&ukf);
              LidarSensor::LidarSensor
                        ((LidarSensor *)this_01,&local_628,&lidar_noise,ukf_parameters.debug);
              std::__cxx11::string::~string((string *)&local_628);
              sensors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &sensors._M_t._M_impl.super__Rb_tree_header._M_header;
              sensors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              sensors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              sensors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              sensors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   sensors._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              std::operator<<((ostream *)&std::cout,"Sensors: ");
              if (use_lidar == true) {
                ppSVar4 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
                          ::operator[](&sensors,&this_01->name_);
                *ppSVar4 = this_01;
                std::operator<<((ostream *)&std::cout,"Lidar ");
              }
              if (use_radar == true) {
                ppSVar4 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
                          ::operator[](&sensors,&this_00->name_);
                *ppSVar4 = this_00;
                std::operator<<((ostream *)&std::cout,"Radar");
              }
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              if (1 < ukf_parameters.debug) {
                if (use_radar == true) {
                  poVar3 = std::operator<<((ostream *)&std::cout,"Radar covariance:\n");
                  pDVar5 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                           Sensor::GetR(this_00);
                  poVar3 = Eigen::operator<<(poVar3,pDVar5);
                  std::endl<char,std::char_traits<char>>(poVar3);
                }
                if (use_lidar == true) {
                  poVar3 = std::operator<<((ostream *)&std::cout,"Lidar covariance:\n");
                  pDVar5 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                           Sensor::GetR(this_01);
                  poVar3 = Eigen::operator<<(poVar3,pDVar5);
                  std::endl<char,std::char_traits<char>>(poVar3);
                }
              }
              this_02 = MeasurementFactory::GetInstance();
              measurements.super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              line._M_dataplus._M_p = (pointer)&line.field_2;
              line._M_string_length = 0;
              measurements.super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>._M_impl
              .super__Vector_impl_data._M_start = (pointer)0x0;
              measurements.super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>._M_impl
              .super__Vector_impl_data._M_finish = (pointer)0x0;
              line.field_2._M_local_buf[0] = '\0';
              while ((piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                         ((istream *)&in_file,(string *)&line),
                     ((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0 &&
                     (n_meas != 0))) {
                std::__cxx11::istringstream::istringstream
                          ((istringstream *)&ukf,(string *)&line,_S_in);
                m = MeasurementFactory::CreateMeasurement(this_02,(istringstream *)&ukf,&sensors);
                if (m != (Measurement *)0x0) {
                  std::vector<Measurement_*,_std::allocator<Measurement_*>_>::push_back
                            (&measurements,&m);
                  n_meas = n_meas + -1;
                }
                std::__cxx11::istringstream::~istringstream((istringstream *)&ukf);
              }
              poVar3 = std::operator<<((ostream *)&std::cout,"Number of measurements: ");
              poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
              std::endl<char,std::char_traits<char>>(poVar3);
              std::ifstream::close();
              UnscentedKalmanFilter::UnscentedKalmanFilter(&ukf,&ukf_parameters);
              iVar2 = 0;
              for (ppMVar7 = measurements.
                             super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                  ppMVar7 !=
                  measurements.super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish; ppMVar7 = ppMVar7 + 1) {
                m_00 = *ppMVar7;
                if (ukf_parameters.debug != 0) {
                  poVar3 = std::operator<<((ostream *)&std::cout,"--- START MEASUREMENT: ");
                  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
                  poVar3 = std::operator<<(poVar3," -------------------------------");
                  std::endl<char,std::char_traits<char>>(poVar3);
                }
                UnscentedKalmanFilter::ProcessMeasurement(&ukf,m_00);
                if (ukf.restart_ == true) {
                  poVar3 = std::operator<<((ostream *)&std::cout,"Filter restarted at measurement ")
                  ;
                  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
                  std::endl<char,std::char_traits<char>>(poVar3);
                }
                operator<<((ostream *)&out_file,m_00);
                iVar2 = iVar2 + 1;
              }
              std::ofstream::close();
              poVar3 = std::operator<<((ostream *)&std::cout,"Accuracy - RMSE:");
              poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
              std::vector<Measurement_*,_std::allocator<Measurement_*>_>::vector
                        ((vector<Measurement_*,_std::allocator<Measurement_*>_> *)&local_690,
                         &measurements);
              Tools::CalculateRMSE((Tools *)&m,(MeasurementContainer *)&local_690);
              poVar3 = Eigen::operator<<(poVar3,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                 *)&m);
              std::endl<char,std::char_traits<char>>(poVar3);
              free(m);
              std::_Vector_base<Measurement_*,_std::allocator<Measurement_*>_>::~_Vector_base
                        (&local_690);
              poVar3 = std::operator<<((ostream *)&std::cout,
                                       "Consistency - percentage above Chi^2(0.050):");
              poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
              std::vector<Measurement_*,_std::allocator<Measurement_*>_>::vector
                        ((vector<Measurement_*,_std::allocator<Measurement_*>_> *)&local_6a8,
                         &measurements);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
              ::_Rb_tree(&local_5e8,&sensors._M_t);
              Tools::CheckConsistency
                        ((Tools *)&m,(MeasurementContainer *)&local_6a8,
                         (SensorContainer *)&local_5e8);
              poVar3 = Eigen::operator<<(poVar3,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                 *)&m);
              std::endl<char,std::char_traits<char>>(poVar3);
              free(m);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
              ::~_Rb_tree(&local_5e8);
              std::_Vector_base<Measurement_*,_std::allocator<Measurement_*>_>::~_Vector_base
                        (&local_6a8);
              poVar3 = std::operator<<((ostream *)&std::cout,"Done!");
              std::endl<char,std::char_traits<char>>(poVar3);
              UnscentedKalmanFilter::~UnscentedKalmanFilter(&ukf);
              std::__cxx11::string::~string((string *)&line);
              std::_Vector_base<Measurement_*,_std::allocator<Measurement_*>_>::~_Vector_base
                        (&measurements.
                          super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
              ::~_Rb_tree(&sensors._M_t);
              free(lidar_noise.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data);
              free(radar_noise.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data);
              std::ofstream::~ofstream(&out_file);
              std::ifstream::~ifstream(&in_file);
              return 0;
            }
            poVar3 = std::operator<<((ostream *)&std::cerr,"Cannot open output file: ");
            poVar3 = std::operator<<(poVar3,(string *)&out_filename_abi_cxx11_);
            std::endl<char,std::char_traits<char>>(poVar3);
          }
          goto LAB_00151999;
        }
      }
    case 99:
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6d:
    case 0x6f:
    case 0x71:
    case 0x75:
    case 0x76:
    case 0x77:
    case 0x78:
      usage();
LAB_00151999:
      exit(1);
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[]) {

  parse_arguments(argc, argv, ukf_parameters);
  ifstream in_file(in_filename.c_str(), ifstream::in);
  ofstream out_file(out_filename.c_str(), ofstream::out);
  check_and_open_files(in_file, in_filename, out_file, out_filename);

  // Initialize covariance matrices of sensors
  VectorXd radar_noise(3);
  radar_noise << std_radr, std_radphi, std_radrd;
  VectorXd lidar_noise(2);
  lidar_noise << std_laspy, std_laspx;

  // Create sensor instances
  Sensor *radar = new RadarSensor("R", radar_noise, ukf_parameters.debug); 
  Sensor *lidar = new LidarSensor("L", lidar_noise, ukf_parameters.debug); 

  // Create sensor collection
  //
  // If a sensor is flagged out, its not included in sensor collection
  // and all measurements of the sensor are discarded.
  SensorContainer sensors;
  std::cout << "Sensors: ";
  if (use_lidar) {
      sensors[lidar->name_] = lidar;
      std::cout << "Lidar ";
  }
  if (use_radar) {
      sensors[radar->name_] = radar;
      std::cout << "Radar";  
  }
  std::cout << std::endl;

  if (ukf_parameters.debug>1) {
      if (use_radar) cout << "Radar covariance:\n" << radar->GetR() << endl;  
      if (use_lidar) cout << "Lidar covariance:\n" << lidar->GetR() << endl;  
  }

  // Get measurement factory
  MeasurementFactory* mf = MeasurementFactory::GetInstance();

  MeasurementContainer measurements;
  string line;

  // Read input file and fill measurement container
  while (getline(in_file, line) && n_meas != 0) {
    Measurement *m;
    istringstream iss(line);

    // Create measurement from input line, and store it to container
    // measurement is only created, if corresponding sensor is present in sensor collection
    m = mf->CreateMeasurement(iss, sensors);
    if (m != 0) {
        measurements.push_back(m);
        n_meas--;
    }
  }
  std::cout << "Number of measurements: " << measurements.size() << std::endl;
  in_file.close();

  // Create a filter instance
  UnscentedKalmanFilter ukf(ukf_parameters);

  // Run measurement through the filter and get estimations
  MeasurementContainer::iterator it;
  int i;
  for(it=measurements.begin(), i=0; it!=measurements.end(); it++, i++) {

    Measurement *m = *it;
    if (ukf_parameters.debug)
        std::cout << "--- START MEASUREMENT: " << i << " -------------------------------" << std::endl;

    ukf.ProcessMeasurement(m);

    if (ukf.restart_)
        std::cout << "Filter restarted at measurement " << i << std::endl;

    out_file << *m; // output estimate 
  }
  out_file.close();


  // Calculate accuracy and check consistency
  // - print out results
  cout << "Accuracy - RMSE:" << endl << Tools::CalculateRMSE(measurements) << endl;
  cout << "Consistency - percentage above Chi^2(0.050):" << endl << Tools::CheckConsistency(measurements, sensors) << endl;
  
  cout << "Done!" << endl;
  return 0;
}